

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall duckdb::ColumnData::ClearUpdates(ColumnData *this)

{
  ::std::mutex::lock(&this->update_lock);
  ::std::__uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_> *)
             &this->updates,(pointer)0x0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->update_lock);
  return;
}

Assistant:

void ColumnData::ClearUpdates() {
	lock_guard<mutex> update_guard(update_lock);
	updates.reset();
}